

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O0

void __thiscall OpenMD::NPAT::evolveEtaA(NPAT *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  long in_RDI;
  SquareMatrix3<double> *this_00;
  double dVar4;
  SquareMatrix3<double> *in_stack_ffffffffffffffd8;
  
  this_00 = (SquareMatrix3<double> *)(*(double *)(in_RDI + 0x10) * *(double *)(in_RDI + 0x128));
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x1b0),*(uint *)(in_RDI + 0x328),
                      *(uint *)(in_RDI + 0x328));
  dVar4 = (double)this_00 * (*pdVar3 - *(double *)(in_RDI + 0x138) / 163882576.0);
  dVar1 = *(double *)(in_RDI + 0xf8);
  dVar2 = *(double *)(in_RDI + 0x110);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),*(uint *)(in_RDI + 0x328),
                      *(uint *)(in_RDI + 0x328));
  *pdVar3 = dVar4 / (dVar1 * dVar2) + *pdVar3;
  SquareMatrix3<double>::operator=(this_00,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void NPAT::evolveEtaA() {
    eta(axis_, axis_) +=
        dt2 * instaVol *
        (press(axis_, axis_) - targetPressure / Constants::pressureConvert) /
        (NkBT * tb2);
    oldEta_ = eta;
  }